

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void AYUVToVURow_C(uint8_t *src_ayuv,int src_stride_ayuv,uint8_t *dst_vu,int width)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = (long)src_stride_ayuv;
  if (0 < width) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      dst_vu[lVar2] =
           (uint8_t)((uint)src_ayuv[lVar2 * 4 + lVar1 + 4] +
                     (uint)src_ayuv[lVar2 * 4 + lVar1] +
                     (uint)src_ayuv[lVar2 * 4 + 4] + (uint)src_ayuv[lVar2 * 4] + 2 >> 2);
      dst_vu[lVar2 + 1] =
           (uint8_t)((uint)src_ayuv[lVar2 * 4 + (long)(src_stride_ayuv + 5)] +
                     (uint)src_ayuv[lVar2 * 4 + (long)(src_stride_ayuv + 1)] +
                     (uint)src_ayuv[lVar2 * 4 + 5] + (uint)src_ayuv[lVar2 * 4 + 1] + 2 >> 2);
      lVar2 = lVar2 + 2;
      lVar3 = lVar3 + 8;
    } while ((int)lVar2 < width);
    src_ayuv = src_ayuv + lVar3;
    dst_vu = dst_vu + lVar2;
  }
  if ((width & 1U) != 0) {
    *dst_vu = (uint8_t)(((uint)src_ayuv[lVar1] + (uint)*src_ayuv) * 2 + 2 >> 2);
    dst_vu[1] = (uint8_t)(((uint)src_ayuv[lVar1 + 1] + (uint)src_ayuv[1]) * 2 + 2 >> 2);
  }
  return;
}

Assistant:

void AYUVToVURow_C(const uint8_t* src_ayuv,
                   int src_stride_ayuv,
                   uint8_t* dst_vu,
                   int width) {
  // Output a row of VU values, filtering 2x2 rows of AYUV.
  int x;
  for (x = 0; x < width; x += 2) {
    dst_vu[0] = (src_ayuv[0] + src_ayuv[4] + src_ayuv[src_stride_ayuv + 0] +
                 src_ayuv[src_stride_ayuv + 4] + 2) >>
                2;
    dst_vu[1] = (src_ayuv[1] + src_ayuv[5] + src_ayuv[src_stride_ayuv + 1] +
                 src_ayuv[src_stride_ayuv + 5] + 2) >>
                2;
    src_ayuv += 8;
    dst_vu += 2;
  }
  if (width & 1) {
    dst_vu[0] = (src_ayuv[0] + src_ayuv[0] + src_ayuv[src_stride_ayuv + 0] +
                 src_ayuv[src_stride_ayuv + 0] + 2) >>
                2;
    dst_vu[1] = (src_ayuv[1] + src_ayuv[1] + src_ayuv[src_stride_ayuv + 1] +
                 src_ayuv[src_stride_ayuv + 1] + 2) >>
                2;
  }
}